

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O3

void __thiscall HyperGraph::build_one_RRset(HyperGraph *this,uint32_t uStart,size_t hyperIdx)

{
  int iVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  ulong *puVar3;
  uint uVar4;
  iterator iVar5;
  pointer pvVar6;
  _Bit_type *p_Var7;
  byte bVar8;
  long lVar9;
  pointer ppVar10;
  ulong uVar11;
  pointer ppVar12;
  ulong uVar13;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  ulong uVar14;
  pair<unsigned_int,_float> *nbr;
  ulong uVar15;
  double dVar16;
  allocator_type local_61;
  unsigned_long local_60;
  HyperGraph *local_58;
  ulong local_50;
  void *local_48 [2];
  long local_38;
  
  pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
           ((this->_FRsets).
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uStart);
  iVar5._M_current = *(unsigned_long **)(pvVar2 + 8);
  local_60 = hyperIdx;
  if (iVar5._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar5,&local_60);
  }
  else {
    *iVar5._M_current = hyperIdx;
    *(unsigned_long **)(pvVar2 + 8) = iVar5._M_current + 1;
  }
  *(this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uStart;
  uVar14 = 1;
  puVar3 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uStart >> 6);
  *puVar3 = *puVar3 | 1L << ((byte)uStart & 0x3f);
  __first._M_current =
       (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  uVar15 = 0;
  local_58 = this;
  do {
    uVar4 = __first._M_current[uVar15];
    local_50 = uVar15;
    if (this->_cascadeModel == LT) {
      pvVar6 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar10 = pvVar6[uVar4].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar12 = *(pointer *)
                 ((long)&pvVar6[uVar4].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (ppVar12 != ppVar10) {
        if (0x17d < dsfmt_global_data.idx) {
          dsfmt_gen_rand_all(&dsfmt_global_data);
          ppVar10 = pvVar6[uVar4].
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar12 = *(pointer *)
                     ((long)&pvVar6[uVar4].
                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             ._M_impl.super__Vector_impl_data + 8);
          dsfmt_global_data.idx = 0;
          this = local_58;
        }
        dVar16 = 2.0 - dsfmt_global_data.status[0].d[dsfmt_global_data.idx];
        if ((double)ppVar10->second <= dVar16) {
          lVar9 = (long)ppVar12 - (long)ppVar10 >> 3;
          if (dVar16 <= (double)ppVar12[-1].second) {
            uVar15 = lVar9 - 1;
            if (uVar15 == 0) goto LAB_0011df9d;
            uVar13 = 0;
            do {
              uVar11 = uVar15 + uVar13 >> 1;
              if ((double)ppVar10[uVar11].second < dVar16) {
                uVar13 = uVar11 + 1;
                uVar11 = uVar15;
              }
              uVar15 = uVar11;
            } while (uVar13 < uVar11);
          }
          else {
            uVar11 = lVar9 + 1;
          }
        }
        else {
LAB_0011df9d:
          uVar11 = 0;
        }
        pvVar6 = (this->_graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)&pvVar6[uVar4].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data;
        if (uVar11 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar6[uVar4].
                                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - lVar9 >> 3)) {
          uVar4 = *(uint *)(lVar9 + uVar11 * 8);
          p_Var7 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar15 = p_Var7[uVar4 >> 6];
          if ((uVar15 >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
            dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
            (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar14] = uVar4;
            uVar14 = uVar14 + 1;
            p_Var7[uVar4 >> 6] = 1L << ((byte)uVar4 & 0x3f) | uVar15;
            pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                     ((this->_FRsets).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar4);
            iVar5._M_current = *(unsigned_long **)(pvVar2 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar5,&local_60);
              this = local_58;
            }
            else {
              *iVar5._M_current = local_60;
              *(unsigned_long **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
            goto LAB_0011e07f;
          }
        }
        __first._M_current =
             (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
        break;
      }
    }
    else if (this->_cascadeModel == IC) {
      pvVar6 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar12 = *(pointer *)
                 ((long)&pvVar6[uVar4].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppVar10 = pvVar6[uVar4].
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar12;
          ppVar10 = ppVar10 + 1) {
        uVar4 = ppVar10->first;
        if (((this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] >>
             ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if (0x17d < dsfmt_global_data.idx) {
            dsfmt_gen_rand_all(&dsfmt_global_data);
            dsfmt_global_data.idx = 0;
            this = local_58;
          }
          iVar1 = dsfmt_global_data.idx + 1;
          lVar9 = (long)dsfmt_global_data.idx;
          dsfmt_global_data.idx = iVar1;
          if (2.0 - dsfmt_global_data.status[0].d[lVar9] <= (double)ppVar10->second) {
            (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar14] = uVar4;
            puVar3 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar4 >> 6);
            *puVar3 = *puVar3 | 1L << ((byte)uVar4 & 0x3f);
            uVar14 = uVar14 + 1;
            pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                     ((this->_FRsets).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar4);
            iVar5._M_current = *(unsigned_long **)(pvVar2 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar5,&local_60);
              this = local_58;
            }
            else {
              *iVar5._M_current = local_60;
              *(unsigned_long **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
          }
        }
      }
    }
LAB_0011e07f:
    uVar15 = local_50 + 1;
    __first._M_current =
         (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start;
  } while (uVar15 < uVar14);
  if (uVar14 != 0) {
    p_Var7 = (this->__vecVisitBool).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar15 = 0;
    do {
      bVar8 = (byte)__first._M_current[uVar15] & 0x3f;
      puVar3 = p_Var7 + (__first._M_current[uVar15] >> 6);
      *puVar3 = *puVar3 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_48,__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(__first._M_current + uVar14),&local_61);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->_RRsets,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return;
}

Assistant:

void build_one_RRset(const uint32_t uStart, const size_t hyperIdx)
    {
        size_t numVisitNode = 0, currIdx = 0;
        _FRsets[uStart].push_back(hyperIdx);
        __vecVisitNode[numVisitNode++] = uStart;
        __vecVisitBool[uStart] = true;
        while (currIdx < numVisitNode)
        {
            const auto expand = __vecVisitNode[currIdx++];
            if (_cascadeModel == IC)
            {
                for (auto& nbr : _graph[expand])
                {
                    const auto nbrId = nbr.first;
                    if (__vecVisitBool[nbrId])
                        continue;
                    const auto randDouble = dsfmt_gv_genrand_open_close();
                    if (randDouble > nbr.second)
                        continue;
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                    _FRsets[nbrId].push_back(hyperIdx);
                }
            }
            else if (_cascadeModel == LT)
            {
                if (_graph[expand].size() == 0)
                    continue;
                const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                const auto nbrId = _graph[expand][nextNbrIdx].first;
                if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                __vecVisitNode[numVisitNode++] = nbrId;
                __vecVisitBool[nbrId] = true;
                _FRsets[nbrId].push_back(hyperIdx);
            }
        }
        for (int i = 0; i < numVisitNode; i++) __vecVisitBool[__vecVisitNode[i]] = false;
        _RRsets.push_back(RRset(__vecVisitNode.begin(), __vecVisitNode.begin() + numVisitNode));
    }